

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

bool S2LatLngRect::IntersectsLatEdge(S2Point *a,S2Point *b,double lat,S1Interval *lng)

{
  S1Interval *pSVar1;
  bool bVar2;
  double *pdVar3;
  ostream *poVar4;
  double dVar5;
  double __y;
  double p;
  double dVar6;
  double dVar7;
  double __x;
  S1Interval SVar8;
  D local_238;
  D local_220;
  undefined1 local_208 [8];
  S2Point isect_1;
  D local_1d8;
  undefined1 local_1c0 [8];
  S2Point isect;
  S1Interval ab_theta;
  double theta;
  double sin_theta;
  double cos_theta;
  S2LogMessage local_178;
  S2LogMessageVoidify local_161;
  double local_160;
  double sin_lat;
  S2LogMessage local_150;
  S2LogMessageVoidify local_13a;
  byte local_139;
  S2LogMessage local_138;
  S2LogMessageVoidify local_121;
  undefined1 local_120 [8];
  Vector3_d x;
  Vector3_d local_f0;
  undefined1 local_d8 [8];
  Vector3_d y;
  Vector3_d local_a8;
  undefined1 local_90 [8];
  Vector3_d z;
  S2LogMessage local_70;
  S2LogMessageVoidify local_5d [20];
  byte local_49;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  S1Interval *local_30;
  S1Interval *lng_local;
  double lat_local;
  S2Point *b_local;
  S2Point *a_local;
  
  local_30 = lng;
  lng_local = (S1Interval *)lat;
  lat_local = (double)b;
  b_local = a;
  bVar2 = S2::IsUnitLength(a);
  local_49 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x186,kFatal,(ostream *)&std::cerr);
    local_49 = 1;
    poVar4 = S2LogMessage::stream(&local_48);
    poVar4 = std::operator<<(poVar4,"Check failed: S2::IsUnitLength(a) ");
    S2LogMessageVoidify::operator&(&local_31,poVar4);
  }
  if ((local_49 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
  }
  bVar2 = S2::IsUnitLength((S2Point *)lat_local);
  z.c_[2]._7_1_ = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x187,kFatal,(ostream *)&std::cerr);
    z.c_[2]._7_1_ = 1;
    poVar4 = S2LogMessage::stream(&local_70);
    poVar4 = std::operator<<(poVar4,"Check failed: S2::IsUnitLength(b) ");
    S2LogMessageVoidify::operator&(local_5d,poVar4);
  }
  if ((z.c_[2]._7_1_ & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_70);
  }
  S2::RobustCrossProd(&local_a8,b_local,(S2Point *)lat_local);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            ((D *)local_90,(BasicVector<Vector3,_double,_3UL> *)&local_a8);
  pdVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                     ((BasicVector<Vector3,_double,_3UL> *)local_90,2);
  if (*pdVar3 <= 0.0 && *pdVar3 != 0.0) {
    util::math::internal_vector::operator-((D *)(y.c_ + 2),(D *)local_90);
    local_90 = (undefined1  [8])y.c_[2];
  }
  Vector3<double>::Vector3((Vector3<double> *)(x.c_ + 2),0.0,0.0,1.0);
  S2::RobustCrossProd(&local_f0,(S2Point *)local_90,(S2Point *)(x.c_ + 2));
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            ((D *)local_d8,(BasicVector<Vector3,_double,_3UL> *)&local_f0);
  Vector3<double>::CrossProd
            ((Vector3<double> *)local_120,(Vector3<double> *)local_d8,(Vector3<double> *)local_90);
  bVar2 = S2::IsUnitLength((S2Point *)local_120);
  local_139 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x191,kFatal,(ostream *)&std::cerr);
    local_139 = 1;
    poVar4 = S2LogMessage::stream(&local_138);
    poVar4 = std::operator<<(poVar4,"Check failed: S2::IsUnitLength(x) ");
    S2LogMessageVoidify::operator&(&local_121,poVar4);
  }
  if ((local_139 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_138);
  }
  pdVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                     ((BasicVector<Vector3,_double,_3UL> *)local_120,2);
  sin_lat._7_1_ = 0;
  if (*pdVar3 < 0.0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x192,kFatal,(ostream *)&std::cerr);
    sin_lat._7_1_ = 1;
    poVar4 = S2LogMessage::stream(&local_150);
    poVar4 = std::operator<<(poVar4,"Check failed: (x[2]) >= (0) ");
    S2LogMessageVoidify::operator&(&local_13a,poVar4);
  }
  if ((sin_lat._7_1_ & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_150);
  }
  local_160 = sin((double)lng_local);
  dVar5 = ABS(local_160);
  pdVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                     ((BasicVector<Vector3,_double,_3UL> *)local_120,2);
  if (dVar5 < *pdVar3) {
    pdVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                       ((BasicVector<Vector3,_double,_3UL> *)local_120,2);
    dVar5 = local_160;
    if (*pdVar3 <= 0.0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_178,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                 ,0x19a,kFatal,(ostream *)&std::cerr);
      poVar4 = S2LogMessage::stream(&local_178);
      poVar4 = std::operator<<(poVar4,"Check failed: (x[2]) > (0) ");
      S2LogMessageVoidify::operator&(&local_161,poVar4);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_178);
    }
    pdVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                       ((BasicVector<Vector3,_double,_3UL> *)local_120,2);
    dVar5 = dVar5 / *pdVar3;
    __y = sqrt(1.0 - dVar5 * dVar5);
    p = atan2(__y,dVar5);
    dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)b_local,(D *)local_d8);
    dVar7 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)b_local,(D *)local_120);
    dVar6 = atan2(dVar6,dVar7);
    dVar7 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)lat_local,(D *)local_d8);
    __x = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)lat_local,(D *)local_120);
    dVar7 = atan2(dVar7,__x);
    SVar8 = S1Interval::FromPointPair(dVar6,dVar7);
    isect.c_[2] = SVar8.bounds_.c_[0];
    bVar2 = S1Interval::Contains((S1Interval *)(isect.c_ + 2),p);
    if (bVar2) {
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator*
                (&local_1d8,(BasicVector<Vector3,_double,_3UL> *)local_120,dVar5);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator*
                ((D *)(isect_1.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)local_d8,__y);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
                ((D *)local_1c0,(BasicVector<Vector3,_double,_3UL> *)&local_1d8,
                 (D *)(isect_1.c_ + 2));
      pSVar1 = local_30;
      pdVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                         ((BasicVector<Vector3,_double,_3UL> *)local_1c0,1);
      dVar6 = *pdVar3;
      pdVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                         ((BasicVector<Vector3,_double,_3UL> *)local_1c0,0);
      dVar6 = atan2(dVar6,*pdVar3);
      bVar2 = S1Interval::Contains(pSVar1,dVar6);
      if (bVar2) {
        return true;
      }
    }
    bVar2 = S1Interval::Contains((S1Interval *)(isect.c_ + 2),-p);
    if (bVar2) {
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator*
                (&local_220,(BasicVector<Vector3,_double,_3UL> *)local_120,dVar5);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator*
                (&local_238,(BasicVector<Vector3,_double,_3UL> *)local_d8,__y);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
                ((D *)local_208,(BasicVector<Vector3,_double,_3UL> *)&local_220,&local_238);
      pSVar1 = local_30;
      pdVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                         ((BasicVector<Vector3,_double,_3UL> *)local_208,1);
      dVar5 = *pdVar3;
      pdVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                         ((BasicVector<Vector3,_double,_3UL> *)local_208,0);
      dVar5 = atan2(dVar5,*pdVar3);
      bVar2 = S1Interval::Contains(pSVar1,dVar5);
      if (bVar2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool S2LatLngRect::IntersectsLatEdge(const S2Point& a, const S2Point& b,
                                     double lat, const S1Interval& lng) {
  // Return true if the segment AB intersects the given edge of constant
  // latitude.  Unfortunately, lines of constant latitude are curves on
  // the sphere.  They can intersect a straight edge in 0, 1, or 2 points.
  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));

  // First, compute the normal to the plane AB that points vaguely north.
  Vector3_d z = S2::RobustCrossProd(a, b).Normalize();
  if (z[2] < 0) z = -z;

  // Extend this to an orthonormal frame (x,y,z) where x is the direction
  // where the great circle through AB achieves its maximium latitude.
  Vector3_d y = S2::RobustCrossProd(z, S2Point(0, 0, 1)).Normalize();
  Vector3_d x = y.CrossProd(z);
  S2_DCHECK(S2::IsUnitLength(x));
  S2_DCHECK_GE(x[2], 0);

  // Compute the angle "theta" from the x-axis (in the x-y plane defined
  // above) where the great circle intersects the given line of latitude.
  double sin_lat = sin(lat);
  if (fabs(sin_lat) >= x[2]) {
    return false;  // The great circle does not reach the given latitude.
  }
  S2_DCHECK_GT(x[2], 0);
  double cos_theta = sin_lat / x[2];
  double sin_theta = sqrt(1 - cos_theta * cos_theta);
  double theta = atan2(sin_theta, cos_theta);

  // The candidate intersection points are located +/- theta in the x-y
  // plane.  For an intersection to be valid, we need to check that the
  // intersection point is contained in the interior of the edge AB and
  // also that it is contained within the given longitude interval "lng".

  // Compute the range of theta values spanned by the edge AB.
  S1Interval ab_theta = S1Interval::FromPointPair(
      atan2(a.DotProd(y), a.DotProd(x)),
      atan2(b.DotProd(y), b.DotProd(x)));

  if (ab_theta.Contains(theta)) {
    // Check if the intersection point is also in the given "lng" interval.
    S2Point isect = x * cos_theta + y * sin_theta;
    if (lng.Contains(atan2(isect[1], isect[0]))) return true;
  }
  if (ab_theta.Contains(-theta)) {
    // Check if the intersection point is also in the given "lng" interval.
    S2Point isect = x * cos_theta - y * sin_theta;
    if (lng.Contains(atan2(isect[1], isect[0]))) return true;
  }
  return false;
}